

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCode.cpp
# Opt level: O1

uint __thiscall Imf_2_5::TimeCode::timeAndFlags(TimeCode *this,Packing packing)

{
  uint uVar1;
  
  uVar1 = this->_time;
  if (packing == FILM24_PACKING) {
    uVar1 = uVar1 & 0xffffff3f;
  }
  else if (packing == TV50_PACKING) {
    return uVar1 & 0x7f7f7fbf | uVar1 >> 8 & 0x8000 | uVar1 >> 8 & 0x800000 |
           (uVar1 & 0x8000) << 0x10;
  }
  return uVar1;
}

Assistant:

unsigned int
TimeCode::timeAndFlags (Packing packing) const
{
    if (packing == TV50_PACKING)
    {
	unsigned int t = _time;

	t &= ~((1 << 6) | (1 << 15) | (1 << 23) | (1 << 30) | (1 << 31));

	t |= ((unsigned int) bgf0() << 15);
	t |= ((unsigned int) bgf2() << 23);
	t |= ((unsigned int) bgf1() << 30);
	t |= ((unsigned int) fieldPhase() << 31);

	return t;
    }
    if (packing == FILM24_PACKING)
    {
	return _time & ~((1 << 6) | (1 << 7));
    }
    else // packing == TV60_PACKING
    {
	return _time;
    }
}